

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_x86.c
# Opt level: O0

void test(void)

{
  cs_err cVar1;
  size_t count_00;
  ulong local_d8;
  size_t j;
  cs_err err;
  size_t count;
  cs_insn *pcStack_b8;
  int i;
  cs_insn *insn;
  uint64_t address;
  platform platforms [4];
  
  memcpy(&address,&DAT_002d3ce0,0xa0);
  insn = (cs_insn *)0x1000;
  for (count._4_4_ = 0; count._4_4_ < 4; count._4_4_ = count._4_4_ + 1) {
    cVar1 = cs_open(platforms[(long)(int)count._4_4_ + -1].opt_type,
                    platforms[(long)(int)count._4_4_ + -1].opt_value,&handle);
    if (cVar1 == CS_ERR_OK) {
      if (*(int *)&platforms[(int)count._4_4_].comment != 0) {
        cs_option(handle,*(cs_opt_type *)&platforms[(int)count._4_4_].comment,
                  (ulong)*(uint *)((long)&platforms[(int)count._4_4_].comment + 4));
      }
      cs_option(handle,CS_OPT_DETAIL,3);
      count_00 = cs_disasm(handle,*(uint8_t **)(platforms + (int)count._4_4_),
                           (size_t)platforms[(int)count._4_4_].code,(uint64_t)insn,0,
                           &stack0xffffffffffffff48);
      if (count_00 == 0) {
        printf("****************\n");
        printf("Platform: %s\n",platforms[(int)count._4_4_].size);
        print_string_hex("Code:",*(uchar **)(platforms + (int)count._4_4_),
                         (size_t)platforms[(int)count._4_4_].code);
        printf("ERROR: Failed to disasm given code!\n");
      }
      else {
        printf("****************\n");
        printf("Platform: %s\n",platforms[(int)count._4_4_].size);
        print_string_hex("Code:",*(uchar **)(platforms + (int)count._4_4_),
                         (size_t)platforms[(int)count._4_4_].code);
        printf("Disasm:\n");
        for (local_d8 = 0; local_d8 < count_00; local_d8 = local_d8 + 1) {
          printf("0x%lx:\t%s\t%s\n",pcStack_b8[local_d8].address,pcStack_b8[local_d8].mnemonic,
                 pcStack_b8[local_d8].op_str);
          print_insn_detail(handle,platforms[(long)(int)count._4_4_ + -1].opt_value,
                            pcStack_b8 + local_d8);
        }
        printf("0x%lx:\n",pcStack_b8[local_d8 - 1].address + (ulong)pcStack_b8[local_d8 - 1].size);
        cs_free(pcStack_b8,count_00);
      }
      printf("\n");
      cs_close(&handle);
    }
    else {
      printf("Failed on cs_open() with error returned: %u\n",(ulong)cVar1);
    }
  }
  return;
}

Assistant:

static void test()
{
//#define X86_CODE32 "\x01\xd8\x81\xc6\x34\x12\x00\x00\x05\x78\x56\x00\x00"
//#define X86_CODE32 "\x05\x78\x56\x00\x00"
//#define X86_CODE32 "\x01\xd8"
//#define X86_CODE32 "\x05\x23\x01\x00\x00"
//#define X86_CODE32 "\x8d\x87\x89\x67\x00\x00"
//#define X86_CODE32 "\xa1\x13\x48\x6d\x3a\x8b\x81\x23\x01\x00\x00\x8b\x84\x39\x23\x01\x00\x00"
//#define X86_CODE32 "\xb4\xc6"	// mov	ah, 0x6c
//#define X86_CODE32 "\x77\x04"	// ja +6
#define X86_CODE64 "\x55\x48\x8b\x05\xb8\x13\x00\x00"
//#define X86_CODE64 "\xe9\x79\xff\xff\xff"	// jmp 0xf7e

#define X86_CODE16 "\x8d\x4c\x32\x08\x01\xd8\x81\xc6\x34\x12\x00\x00\x05\x23\x01\x00\x00\x36\x8b\x84\x91\x23\x01\x00\x00\x41\x8d\x84\x39\x89\x67\x00\x00\x8d\x87\x89\x67\x00\x00\xb4\xc6"
//#define X86_CODE16 "\x67\x00\x18"
#define X86_CODE32 "\x8d\x4c\x32\x08\x01\xd8\x81\xc6\x34\x12\x00\x00\x05\x23\x01\x00\x00\x36\x8b\x84\x91\x23\x01\x00\x00\x41\x8d\x84\x39\x89\x67\x00\x00\x8d\x87\x89\x67\x00\x00\xb4\xc6"
//#define X86_CODE32 "\x0f\xa7\xc0"	// xstorerng
//#define X86_CODE32 "\x64\xa1\x18\x00\x00\x00"	// mov eax, dword ptr fs:[18]
//#define X86_CODE32 "\x64\xa3\x00\x00\x00\x00"	// mov [fs:0x0], eax
//#define X86_CODE32 "\xd1\xe1"	// shl ecx, 1
//#define X86_CODE32 "\xd1\xc8"	// ror eax, 1
//#define X86_CODE32 "\x83\xC0\x80"	// add	eax, -x80
//#define X86_CODE32 "\xe8\x26\xfe\xff\xff"		// call	0xe2b
//#define X86_CODE32 "\xcd\x80"		// int 0x80
//#define X86_CODE32 "\x24\xb8"		// and    $0xb8,%al
//#define X86_CODE32 "\xf0\x01\xd8"   // lock add eax,ebx
//#define X86_CODE32 "\xf3\xaa"		// rep stosb

	struct platform platforms[] = {
		{
			CS_ARCH_X86,
			CS_MODE_16,
			(unsigned char *)X86_CODE16,
			sizeof(X86_CODE16) - 1,
			"X86 16bit (Intel syntax)"
		},
		{
			CS_ARCH_X86,
			CS_MODE_32,
			(unsigned char *)X86_CODE32,
			sizeof(X86_CODE32) - 1,
			"X86 32 (AT&T syntax)",
			CS_OPT_SYNTAX,
			CS_OPT_SYNTAX_ATT,
		},
		{
			CS_ARCH_X86,
			CS_MODE_32,
			(unsigned char *)X86_CODE32,
			sizeof(X86_CODE32) - 1,
			"X86 32 (Intel syntax)"
		},
		{
			CS_ARCH_X86,
			CS_MODE_64,
			(unsigned char *)X86_CODE64,
			sizeof(X86_CODE64) - 1,
			"X86 64 (Intel syntax)"
		},
	};

	uint64_t address = 0x1000;
	cs_insn *insn;
	int i;
	size_t count;

	for (i = 0; i < sizeof(platforms)/sizeof(platforms[0]); i++) {
		cs_err err = cs_open(platforms[i].arch, platforms[i].mode, &handle);
		if (err) {
			printf("Failed on cs_open() with error returned: %u\n", err);
			continue;
		}

		if (platforms[i].opt_type)
			cs_option(handle, platforms[i].opt_type, platforms[i].opt_value);

		cs_option(handle, CS_OPT_DETAIL, CS_OPT_ON);

		count = cs_disasm(handle, platforms[i].code, platforms[i].size, address, 0, &insn);
		if (count) {
			size_t j;

			printf("****************\n");
			printf("Platform: %s\n", platforms[i].comment);
			print_string_hex("Code:", platforms[i].code, platforms[i].size);
			printf("Disasm:\n");

			for (j = 0; j < count; j++) {
				printf("0x%"PRIx64":\t%s\t%s\n", insn[j].address, insn[j].mnemonic, insn[j].op_str);
				print_insn_detail(handle, platforms[i].mode, &insn[j]);
			}
			printf("0x%"PRIx64":\n", insn[j-1].address + insn[j-1].size);

			// free memory allocated by cs_disasm()
			cs_free(insn, count);
		} else {
			printf("****************\n");
			printf("Platform: %s\n", platforms[i].comment);
			print_string_hex("Code:", platforms[i].code, platforms[i].size);
			printf("ERROR: Failed to disasm given code!\n");
		}

		printf("\n");

		cs_close(&handle);
	}
}